

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_parser.cpp
# Opt level: O2

void __thiscall
ArgParser::add(ArgParser *this,bool *var,string *name,string *shortName,string *description)

{
  string local_160;
  string local_140;
  string local_120;
  ArgHolder arg;
  
  std::__cxx11::string::string((string *)&local_120,(string *)name);
  std::__cxx11::string::string((string *)&local_140,(string *)shortName);
  std::__cxx11::string::string((string *)&local_160,(string *)description);
  ArgHolder::ArgHolder(&arg,&local_120,&local_140,&local_160,true);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_120);
  arg.argType = ARG_FLAG;
  arg.varFLAG = var;
  std::vector<ArgHolder,_std::allocator<ArgHolder>_>::push_back(&this->m_args,&arg);
  ArgHolder::~ArgHolder(&arg);
  return;
}

Assistant:

void ArgParser::add(bool *var,
                    std::string name, std::string shortName, std::string description)
{
    ArgHolder arg(name, shortName, description, true);
    arg.varFLAG = var;
    arg.argType = ARG_FLAG;
    m_args.push_back(arg);
}